

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Primitive *prim;
  ulong uVar15;
  undefined1 auVar16 [16];
  vint4 bi;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  vint4 ai;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar25;
  float fVar28;
  float fVar29;
  undefined1 auVar26 [16];
  float fVar30;
  undefined1 auVar27 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  Precalculations pre;
  NodeRef stack [244];
  Precalculations local_881;
  Ray *local_880;
  ulong local_878;
  ulong *local_870;
  RayQueryContext *local_868;
  long local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_870 = local_7d0;
      auVar16 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx((undefined1  [16])aVar3,auVar26);
      auVar31._8_4_ = 0x219392ef;
      auVar31._0_8_ = 0x219392ef219392ef;
      auVar31._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar31,1);
      auVar26 = vblendvps_avx((undefined1  [16])aVar3,auVar31,auVar26);
      auVar31 = vrcpps_avx(auVar26);
      fVar25 = auVar31._0_4_;
      auVar22._0_4_ = fVar25 * auVar26._0_4_;
      fVar28 = auVar31._4_4_;
      auVar22._4_4_ = fVar28 * auVar26._4_4_;
      fVar29 = auVar31._8_4_;
      auVar22._8_4_ = fVar29 * auVar26._8_4_;
      fVar30 = auVar31._12_4_;
      auVar22._12_4_ = fVar30 * auVar26._12_4_;
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar32,auVar22);
      auVar23._0_4_ = fVar25 + fVar25 * auVar26._0_4_;
      auVar23._4_4_ = fVar28 + fVar28 * auVar26._4_4_;
      auVar23._8_4_ = fVar29 + fVar29 * auVar26._8_4_;
      auVar23._12_4_ = fVar30 + fVar30 * auVar26._12_4_;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_7e8._4_4_ = uVar2;
      local_7e8._0_4_ = uVar2;
      local_7e8._8_4_ = uVar2;
      local_7e8._12_4_ = uVar2;
      auVar34 = ZEXT1664(local_7e8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_7f8._4_4_ = uVar2;
      local_7f8._0_4_ = uVar2;
      local_7f8._8_4_ = uVar2;
      local_7f8._12_4_ = uVar2;
      auVar35 = ZEXT1664(local_7f8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_808._4_4_ = uVar2;
      local_808._0_4_ = uVar2;
      local_808._8_4_ = uVar2;
      local_808._12_4_ = uVar2;
      auVar36 = ZEXT1664(local_808);
      local_818 = vshufps_avx(auVar23,auVar23,0);
      auVar37 = ZEXT1664(local_818);
      auVar26 = vmovshdup_avx(auVar23);
      local_828 = vshufps_avx(auVar23,auVar23,0x55);
      auVar38 = ZEXT1664(local_828);
      auVar31 = vshufpd_avx(auVar23,auVar23,1);
      local_878 = (ulong)(auVar23._0_4_ < 0.0) << 4;
      local_838 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar24 = ZEXT1664(local_838);
      uVar11 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x20;
      uVar15 = (ulong)(auVar31._0_4_ < 0.0) << 4 | 0x40;
      uVar12 = local_878 ^ 0x10;
      local_848 = vshufps_avx(auVar16,auVar16,0);
      auVar27 = ZEXT1664(local_848);
      local_858 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      auVar33 = ZEXT1664(local_858);
      uVar13 = local_878;
      local_880 = ray;
      local_868 = context;
LAB_002cab6d:
      do {
        uVar14 = local_870[-1];
        local_870 = local_870 + -1;
        while ((uVar14 & 8) == 0) {
          auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar13),auVar34._0_16_);
          auVar16._0_4_ = auVar37._0_4_ * auVar26._0_4_;
          auVar16._4_4_ = auVar37._4_4_ * auVar26._4_4_;
          auVar16._8_4_ = auVar37._8_4_ * auVar26._8_4_;
          auVar16._12_4_ = auVar37._12_4_ * auVar26._12_4_;
          auVar26 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar11),auVar35._0_16_);
          auVar17._0_4_ = auVar38._0_4_ * auVar26._0_4_;
          auVar17._4_4_ = auVar38._4_4_ * auVar26._4_4_;
          auVar17._8_4_ = auVar38._8_4_ * auVar26._8_4_;
          auVar17._12_4_ = auVar38._12_4_ * auVar26._12_4_;
          auVar26 = vpmaxsd_avx(auVar16,auVar17);
          auVar16 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar15),auVar36._0_16_);
          auVar18._0_4_ = auVar24._0_4_ * auVar16._0_4_;
          auVar18._4_4_ = auVar24._4_4_ * auVar16._4_4_;
          auVar18._8_4_ = auVar24._8_4_ * auVar16._8_4_;
          auVar18._12_4_ = auVar24._12_4_ * auVar16._12_4_;
          auVar16 = vpmaxsd_avx(auVar18,auVar27._0_16_);
          auVar26 = vpmaxsd_avx(auVar26,auVar16);
          auVar16 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar12),auVar34._0_16_);
          auVar19._0_4_ = auVar37._0_4_ * auVar16._0_4_;
          auVar19._4_4_ = auVar37._4_4_ * auVar16._4_4_;
          auVar19._8_4_ = auVar37._8_4_ * auVar16._8_4_;
          auVar19._12_4_ = auVar37._12_4_ * auVar16._12_4_;
          auVar16 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + (uVar11 ^ 0x10)),
                               auVar35._0_16_);
          auVar20._0_4_ = auVar38._0_4_ * auVar16._0_4_;
          auVar20._4_4_ = auVar38._4_4_ * auVar16._4_4_;
          auVar20._8_4_ = auVar38._8_4_ * auVar16._8_4_;
          auVar20._12_4_ = auVar38._12_4_ * auVar16._12_4_;
          auVar16 = vpminsd_avx(auVar19,auVar20);
          auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + (uVar15 ^ 0x10)),
                               auVar36._0_16_);
          auVar21._0_4_ = auVar24._0_4_ * auVar31._0_4_;
          auVar21._4_4_ = auVar24._4_4_ * auVar31._4_4_;
          auVar21._8_4_ = auVar24._8_4_ * auVar31._8_4_;
          auVar21._12_4_ = auVar24._12_4_ * auVar31._12_4_;
          auVar31 = vpminsd_avx(auVar21,auVar33._0_16_);
          auVar16 = vpminsd_avx(auVar16,auVar31);
          auVar26 = vpcmpgtd_avx(auVar26,auVar16);
          iVar8 = vmovmskps_avx(auVar26);
          if (iVar8 == 0xf) {
            if (local_870 == &local_7d8) {
              return;
            }
            goto LAB_002cab6d;
          }
          bVar7 = (byte)iVar8 ^ 0xf;
          uVar6 = uVar14 & 0xfffffffffffffff0;
          lVar4 = 0;
          if (bVar7 != 0) {
            for (; (bVar7 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar14 = *(ulong *)(uVar6 + lVar4 * 8);
          uVar10 = bVar7 - 1 & (uint)bVar7;
          if (uVar10 != 0) {
            *local_870 = uVar14;
            local_870 = local_870 + 1;
            lVar4 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar14 = *(ulong *)(uVar6 + lVar4 * 8);
            uVar10 = uVar10 - 1 & uVar10;
            uVar9 = (ulong)uVar10;
            if (uVar10 != 0) {
              do {
                *local_870 = uVar14;
                local_870 = local_870 + 1;
                lVar4 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                  }
                }
                uVar14 = *(ulong *)(uVar6 + lVar4 * 8);
                uVar9 = uVar9 & uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
        }
        local_860 = (ulong)((uint)uVar14 & 0xf) - 8;
        if (local_860 != 0) {
          prim = (Primitive *)(uVar14 & 0xfffffffffffffff0);
          do {
            bVar5 = InstanceArrayIntersector1::occluded(&local_881,ray,local_868,prim);
            if (bVar5) {
              local_880->tfar = -INFINITY;
              return;
            }
            prim = prim + 1;
            local_860 = local_860 + -1;
            ray = local_880;
          } while (local_860 != 0);
        }
        auVar34 = ZEXT1664(local_7e8);
        auVar35 = ZEXT1664(local_7f8);
        auVar36 = ZEXT1664(local_808);
        auVar37 = ZEXT1664(local_818);
        auVar38 = ZEXT1664(local_828);
        auVar24 = ZEXT1664(local_838);
        auVar27 = ZEXT1664(local_848);
        auVar33 = ZEXT1664(local_858);
        uVar13 = local_878;
      } while (local_870 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }